

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_rawlen(lua_State *L)

{
  TValue *pTVar1;
  MSize MVar2;
  GCtab *t;
  TValue *pTVar3;
  
  pTVar1 = L->base;
  pTVar3 = L->top;
  if ((pTVar1 < pTVar3) && ((pTVar1->field_2).it == 0xfffffffb)) {
    MVar2 = *(MSize *)((ulong)(pTVar1->u32).lo + 0xc);
  }
  else {
    t = lj_lib_checktab(L,1);
    MVar2 = lj_tab_len(t);
    pTVar3 = L->top;
  }
  pTVar3[-1].n = (double)(int)MVar2;
  return 1;
}

Assistant:

LJLIB_CF(rawlen)		LJLIB_REC(.)
{
  cTValue *o = L->base;
  int32_t len;
  if (L->top > o && tvisstr(o))
    len = (int32_t)strV(o)->len;
  else
    len = (int32_t)lj_tab_len(lj_lib_checktab(L, 1));
  setintV(L->top-1, len);
  return 1;
}